

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bond.hpp
# Opt level: O2

void __thiscall OpenMD::Bond::~Bond(Bond *this)

{
  (this->super_ShortRangeInteraction)._vptr_ShortRangeInteraction =
       (_func_int **)&PTR__Bond_002c2550;
  std::__cxx11::string::~string((string *)&this->name_);
  ShortRangeInteraction::~ShortRangeInteraction(&this->super_ShortRangeInteraction);
  return;
}

Assistant:

virtual ~Bond() {}